

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermIterators.hpp
# Opt level: O3

void __thiscall Kernel::VariableIterator::VariableIterator(VariableIterator *this,TermList t)

{
  TermList ***pppTVar1;
  uint uVar2;
  uint uVar3;
  size_t sVar4;
  TermList TVar5;
  TermList **ppTVar6;
  TermList *pTVar7;
  int iVar8;
  int iVar9;
  
  (this->super_IteratorCore<Kernel::TermList>)._refCnt = 0;
  (this->super_IteratorCore<Kernel::TermList>)._vptr_IteratorCore =
       (_func_int **)&PTR__VariableIterator_00b3d820;
  (this->_stack)._capacity = 8;
  ppTVar6 = (TermList **)
            Lib::FixedSizeAllocator<64UL>::alloc
                      ((FixedSizeAllocator<64UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
  (this->_stack)._stack = ppTVar6;
  sVar4 = (this->_stack)._capacity;
  (this->_stack)._cursor = ppTVar6;
  (this->_stack)._end = ppTVar6 + sVar4;
  this->_used = false;
  this->_aux[0]._content = 2;
  this->_aux[1]._content = 2;
  if ((t._content & 1) == 0) {
    uVar2 = *(uint *)(t._content + 0xc);
    if ((*(byte *)(t._content + 0x28) & 8) != 0) {
      iVar8 = 0;
      TVar5._content = t._content;
      uVar3 = uVar2;
      while ((int)uVar3 < 0) {
        TVar5._content = *(ulong *)(TVar5._content + 0x20);
        if ((TVar5._content & 1) != 0) {
          iVar9 = 3;
          goto LAB_002d57ea;
        }
        iVar8 = iVar8 + 2;
        uVar3 = *(uint *)(TVar5._content + 0xc);
      }
      iVar9 = *(int *)(TVar5._content + 0x20);
LAB_002d57ea:
      if (iVar8 + iVar9 == 0) {
        return;
      }
    }
    if (sVar4 == 0) {
      Lib::Stack<const_Kernel::TermList_*>::expand(&this->_stack);
      ppTVar6 = (this->_stack)._cursor;
    }
    pTVar7 = (TermList *)(t._content + 0x28 + (ulong)(uVar2 & 0xfffffff) * 8);
  }
  else {
    this->_aux[0]._content = 2;
    this->_aux[1]._content = t._content;
    if (sVar4 == 0) {
      Lib::Stack<const_Kernel::TermList_*>::expand(&this->_stack);
      ppTVar6 = (this->_stack)._cursor;
    }
    pTVar7 = this->_aux + 1;
  }
  *ppTVar6 = pTVar7;
  pppTVar1 = &(this->_stack)._cursor;
  *pppTVar1 = *pppTVar1 + 1;
  return;
}

Assistant:

VariableIterator(TermList t) : _stack(8), _used(false)
  {
    if(t.isVar()) {
      // see #hack 1
      _aux[0] = TermList::empty();
      _aux[1]=t;
      _stack.push(&_aux[1]);
    }
    else {
      Term* term=t.term();
      if(!term->shared() || !term->ground()) {
	_stack.push(term->args());
      }
    }
  }